

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerThread.cxx
# Opt level: O1

ScopesResponse * __thiscall
cmDebugger::cmDebuggerThread::GetScopesResponse
          (ScopesResponse *__return_storage_ptr__,cmDebuggerThread *this,int64_t frameId,
          bool supportsVariableType)

{
  ulong uVar1;
  pointer pcVar2;
  _Hash_node_base *p_Var3;
  vector<std::shared_ptr<cmDebugger::cmDebuggerVariables>,std::allocator<std::shared_ptr<cmDebugger::cmDebuggerVariables>>>
  *this_00;
  mapped_type *this_01;
  ulong uVar4;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  shared_ptr<cmDebugger::cmDebuggerVariables> localVariables;
  shared_ptr<cmDebugger::cmDebuggerStackFrame> frame;
  unique_lock<std::mutex> lock;
  Source source;
  Scope scope;
  _Hash_node_base *local_3b0;
  shared_ptr<cmDebugger::cmDebuggerVariables> local_3a8;
  shared_ptr<cmDebugger::cmDebuggerStackFrame> local_398;
  unique_lock<std::mutex> local_388;
  vector<dap::any,_std::allocator<dap::any>_> local_378;
  undefined1 local_358 [96];
  _Alloc_hider local_2f8;
  size_type local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  bool local_2d8;
  _Alloc_hider local_2d0;
  size_type local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  bool local_2b0;
  _Alloc_hider local_2a8;
  size_type local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  bool local_288;
  _Alloc_hider local_280;
  size_type local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  bool local_260;
  integer local_258;
  bool local_250;
  undefined1 local_248 [24];
  bool bStack_230;
  undefined1 local_220 [88];
  _Alloc_hider local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8 [2];
  _Alloc_hider local_198;
  char *local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  bool local_178;
  undefined1 local_170 [128];
  bool local_f0;
  string local_e8 [32];
  bool local_c8;
  string local_c0 [32];
  bool local_a0;
  string local_98 [32];
  bool local_78;
  integer local_70;
  bool local_68;
  vector<dap::Source,_std::allocator<dap::Source>_> local_60;
  bool local_48;
  bool local_40;
  integer local_38;
  
  local_388._M_device = &this->Mutex;
  local_388._M_owns = false;
  local_3b0 = (_Hash_node_base *)frameId;
  std::unique_lock<std::mutex>::lock(&local_388);
  local_388._M_owns = true;
  uVar1 = (this->FrameScopes)._M_h._M_bucket_count;
  uVar4 = (ulong)local_3b0 % uVar1;
  p_Var5 = (this->FrameScopes)._M_h._M_buckets[uVar4];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var5->_M_nxt, p_Var6 = p_Var5, local_3b0 != p_Var5->_M_nxt[1]._M_nxt)) {
    while (p_Var5 = p_Var3, p_Var3 = p_Var5->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)p_Var3[1]._M_nxt % uVar1 != uVar4) ||
         (p_Var6 = p_Var5, local_3b0 == p_Var3[1]._M_nxt)) goto LAB_0043fcbb;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_0043fcbb:
  if (p_Var6 == (__node_base_ptr)0x0) {
    p_Var3 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var3 = p_Var6->_M_nxt;
  }
  if (p_Var3 == (_Hash_node_base *)0x0) {
    uVar1 = (this->FrameMap)._M_h._M_bucket_count;
    uVar4 = (ulong)local_3b0 % uVar1;
    p_Var5 = (this->FrameMap)._M_h._M_buckets[uVar4];
    p_Var6 = (__node_base_ptr)0x0;
    if ((p_Var5 != (__node_base_ptr)0x0) &&
       (p_Var3 = p_Var5->_M_nxt, p_Var6 = p_Var5, local_3b0 != p_Var5->_M_nxt[1]._M_nxt)) {
      while (p_Var5 = p_Var3, p_Var3 = p_Var5->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
        p_Var6 = (__node_base_ptr)0x0;
        if (((ulong)p_Var3[1]._M_nxt % uVar1 != uVar4) ||
           (p_Var6 = p_Var5, local_3b0 == p_Var3[1]._M_nxt)) goto LAB_0043fd5f;
      }
      p_Var6 = (__node_base_ptr)0x0;
    }
LAB_0043fd5f:
    if (p_Var6 == (__node_base_ptr)0x0) {
      p_Var3 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var3 = p_Var6->_M_nxt;
    }
    if (p_Var3 == (_Hash_node_base *)0x0) {
      (__return_storage_ptr__->scopes).super__Vector_base<dap::Scope,_std::allocator<dap::Scope>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->scopes).super__Vector_base<dap::Scope,_std::allocator<dap::Scope>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->scopes).super__Vector_base<dap::Scope,_std::allocator<dap::Scope>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    else {
      local_398.super___shared_ptr<cmDebugger::cmDebuggerStackFrame,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)p_Var3[2]._M_nxt;
      local_398.super___shared_ptr<cmDebugger::cmDebuggerStackFrame,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var3[3]._M_nxt;
      if (local_398.super___shared_ptr<cmDebugger::cmDebuggerStackFrame,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_398.
           super___shared_ptr<cmDebugger::cmDebuggerStackFrame,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_398.
                super___shared_ptr<cmDebugger::cmDebuggerStackFrame,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_398.
           super___shared_ptr<cmDebugger::cmDebuggerStackFrame,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_398.
                super___shared_ptr<cmDebugger::cmDebuggerStackFrame,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_220._0_8_ = local_220 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"Locals","");
      cmDebuggerVariablesHelper::Create
                ((cmDebuggerVariablesHelper *)&local_3a8,&this->VariablesManager,(string *)local_220
                 ,supportsVariableType,&local_398);
      if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
        operator_delete((void *)local_220._0_8_,local_220._16_8_ + 1);
      }
      this_00 = (vector<std::shared_ptr<cmDebugger::cmDebuggerVariables>,std::allocator<std::shared_ptr<cmDebugger::cmDebuggerVariables>>>
                 *)std::__detail::
                   _Map_base<long,_std::pair<const_long,_std::vector<std::shared_ptr<cmDebugger::cmDebuggerVariables>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerVariables>_>_>_>,_std::allocator<std::pair<const_long,_std::vector<std::shared_ptr<cmDebugger::cmDebuggerVariables>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerVariables>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<long,_std::pair<const_long,_std::vector<std::shared_ptr<cmDebugger::cmDebuggerVariables>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerVariables>_>_>_>,_std::allocator<std::pair<const_long,_std::vector<std::shared_ptr<cmDebugger::cmDebuggerVariables>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerVariables>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&this->FrameVariables,(key_type *)&local_3b0);
      std::
      vector<std::shared_ptr<cmDebugger::cmDebuggerVariables>,std::allocator<std::shared_ptr<cmDebugger::cmDebuggerVariables>>>
      ::emplace_back<std::shared_ptr<cmDebugger::cmDebuggerVariables>&>(this_00,&local_3a8);
      dap::Scope::Scope((Scope *)local_220);
      pcVar2 = ((local_3a8.
                 super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->Name)._M_dataplus._M_p;
      local_358._0_8_ = local_358 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_358,pcVar2,
                 pcVar2 + ((local_3a8.
                            super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->Name)._M_string_length);
      std::__cxx11::string::operator=((string *)&local_1c8,(string *)local_358);
      if ((undefined1 *)local_358._0_8_ != local_358 + 0x10) {
        operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
      }
      std::__cxx11::string::_M_replace((ulong)&local_198,0,local_190,0x86320f);
      local_178 = true;
      local_38.val = (local_3a8.
                      super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->Id;
      local_378.super__Vector_base<dap::any,_std::allocator<dap::any>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_378.super__Vector_base<dap::any,_std::allocator<dap::any>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_378.super__Vector_base<dap::any,_std::allocator<dap::any>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_358._0_8_ = (void *)0x0;
      local_358._8_8_ = (TypeInfo *)0x0;
      local_358._16_8_ = (void *)0x0;
      dap::any::operator=((any *)local_358,&local_378);
      std::vector<dap::any,_std::allocator<dap::any>_>::~vector(&local_378);
      local_358[0x38] = false;
      local_358._64_8_ = (pointer)0x0;
      local_358[0x48] = 0;
      local_358._73_7_ = 0;
      local_358[0x50] = 0;
      local_358._81_8_ = 0;
      local_2f8._M_p = (pointer)&local_2e8;
      local_2f0 = 0;
      local_2e8._M_local_buf[0] = '\0';
      local_2d8 = false;
      local_2d0._M_p = (pointer)&local_2c0;
      local_2c8 = 0;
      local_2c0._M_local_buf[0] = '\0';
      local_2b0 = false;
      local_2a8._M_p = (pointer)&local_298;
      local_2a0 = 0;
      local_298._M_local_buf[0] = '\0';
      local_288 = false;
      local_280._M_p = (pointer)&local_270;
      local_278 = 0;
      local_270._M_local_buf[0] = '\0';
      local_260 = false;
      local_258.val = 0;
      local_250 = false;
      local_248[0x10] = 0;
      stack0xfffffffffffffdc9 = 0;
      local_248._0_8_ = (pointer)0x0;
      local_248[8] = 0;
      local_248._9_7_ = 0;
      std::__cxx11::string::_M_assign((string *)&local_2f8);
      local_2d8 = true;
      std::__cxx11::string::_M_assign((string *)&local_2a8);
      local_288 = local_2d8;
      dap::any::operator=((any *)local_170,(any *)local_358);
      local_170[0x38] = local_358[0x38];
      std::vector<dap::Checksum,_std::allocator<dap::Checksum>_>::operator=
                ((vector<dap::Checksum,_std::allocator<dap::Checksum>_> *)(local_170 + 0x40),
                 (vector<dap::Checksum,_std::allocator<dap::Checksum>_> *)(local_358 + 0x40));
      local_170[0x58] = local_358[0x58];
      std::__cxx11::string::_M_assign((string *)(local_170 + 0x60));
      local_f0 = local_2d8;
      std::__cxx11::string::_M_assign(local_e8);
      local_c8 = local_2b0;
      std::__cxx11::string::_M_assign(local_c0);
      local_a0 = local_288;
      std::__cxx11::string::_M_assign(local_98);
      local_78 = local_260;
      local_70.val = local_258.val;
      local_68 = local_250;
      std::vector<dap::Source,_std::allocator<dap::Source>_>::operator=
                (&local_60,(vector<dap::Source,_std::allocator<dap::Source>_> *)local_248);
      local_48 = bStack_230;
      local_40 = true;
      this_01 = std::__detail::
                _Map_base<long,_std::pair<const_long,_std::vector<dap::Scope,_std::allocator<dap::Scope>_>_>,_std::allocator<std::pair<const_long,_std::vector<dap::Scope,_std::allocator<dap::Scope>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<long,_std::pair<const_long,_std::vector<dap::Scope,_std::allocator<dap::Scope>_>_>,_std::allocator<std::pair<const_long,_std::vector<dap::Scope,_std::allocator<dap::Scope>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&this->FrameScopes,(key_type *)&local_3b0);
      std::vector<dap::Scope,_std::allocator<dap::Scope>_>::push_back
                (this_01,(value_type *)local_220);
      (__return_storage_ptr__->scopes).super__Vector_base<dap::Scope,_std::allocator<dap::Scope>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->scopes).super__Vector_base<dap::Scope,_std::allocator<dap::Scope>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->scopes).super__Vector_base<dap::Scope,_std::allocator<dap::Scope>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<dap::Scope,_std::allocator<dap::Scope>_>::push_back
                (&__return_storage_ptr__->scopes,(value_type *)local_220);
      dap::Source::~Source((Source *)local_358);
      dap::Source::~Source((Source *)local_170);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_p != &local_188) {
        operator_delete(local_198._M_p,local_188._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_p != local_1b8) {
        operator_delete(local_1c8._M_p,local_1b8[0]._M_allocated_capacity + 1);
      }
      if (local_3a8.super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_3a8.
                   super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_398.super___shared_ptr<cmDebugger::cmDebuggerStackFrame,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_398.
                   super___shared_ptr<cmDebugger::cmDebuggerStackFrame,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
  }
  else {
    (__return_storage_ptr__->scopes).super__Vector_base<dap::Scope,_std::allocator<dap::Scope>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->scopes).super__Vector_base<dap::Scope,_std::allocator<dap::Scope>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->scopes).super__Vector_base<dap::Scope,_std::allocator<dap::Scope>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<dap::Scope,_std::allocator<dap::Scope>_>::operator=
              (&__return_storage_ptr__->scopes,
               (vector<dap::Scope,_std::allocator<dap::Scope>_> *)(p_Var3 + 2));
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_388);
  return __return_storage_ptr__;
}

Assistant:

dap::ScopesResponse cmDebuggerThread::GetScopesResponse(
  int64_t frameId, bool supportsVariableType)
{
  std::unique_lock<std::mutex> lock(Mutex);
  auto it = FrameScopes.find(frameId);

  if (it != FrameScopes.end()) {
    dap::ScopesResponse response;
    response.scopes = it->second;
    return response;
  }

  auto it2 = FrameMap.find(frameId);
  if (it2 == FrameMap.end()) {
    return dap::ScopesResponse();
  }

  std::shared_ptr<cmDebuggerStackFrame> frame = it2->second;
  std::shared_ptr<cmDebuggerVariables> localVariables =
    cmDebuggerVariablesHelper::Create(VariablesManager, "Locals",
                                      supportsVariableType, frame);

  FrameVariables[frameId].emplace_back(localVariables);

  dap::Scope scope;
  scope.name = localVariables->GetName();
  scope.presentationHint = "locals";
  scope.variablesReference = localVariables->GetId();

  dap::Source source;
  source.name = frame->GetFileName();
  source.path = source.name;
  scope.source = source;

  FrameScopes[frameId].push_back(scope);

  dap::ScopesResponse response;
  response.scopes.push_back(scope);
  return response;
}